

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O3

ES5HeapArgumentsObject * __thiscall
Js::HeapArgumentsObject::ConvertToES5HeapArgumentsObject
          (HeapArgumentsObject *this,bool overwriteArgsUsingFrameObject)

{
  _func_int **pp_Var1;
  BVSparse<Memory::Recycler> *this_00;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  BOOL BVar5;
  INT_PTR *pIVar6;
  undefined4 *puVar7;
  Var value;
  BVIndex i;
  
  BVar5 = CrossSite::IsCrossSiteObjectTyped<Js::HeapArgumentsObject>(this);
  pp_Var1 = (this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
  if (BVar5 == 0) {
    if (pp_Var1 == (_func_int **)VirtualTableInfo<Js::HeapArgumentsObject>::Address) {
      pIVar6 = &VirtualTableInfo<Js::ES5HeapArgumentsObject>::Address;
      goto LAB_00b1758b;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x122,
                                "(VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this))",
                                "VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this)");
    if (!bVar3) goto LAB_00b175f8;
    pIVar6 = &VirtualTableInfo<Js::ES5HeapArgumentsObject>::Address;
  }
  else {
    if (pp_Var1 ==
        (_func_int **)VirtualTableInfo<Js::CrossSiteObject<Js::HeapArgumentsObject>_>::Address) {
      pIVar6 = &VirtualTableInfo<Js::CrossSiteObject<Js::ES5HeapArgumentsObject>_>::Address;
      goto LAB_00b1758b;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ArgumentsObject.cpp"
                                ,0x127,
                                "(VirtualTableInfo<CrossSiteObject<HeapArgumentsObject>>::HasVirtualTable(this))"
                                ,
                                "VirtualTableInfo<CrossSiteObject<HeapArgumentsObject>>::HasVirtualTable(this)"
                               );
    if (!bVar3) {
LAB_00b175f8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pIVar6 = &VirtualTableInfo<Js::CrossSiteObject<Js::ES5HeapArgumentsObject>_>::Address;
  }
  *puVar7 = 0;
LAB_00b1758b:
  (this->super_ArgumentsObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)*pIVar6;
  if ((overwriteArgsUsingFrameObject) && (this->formalCount != 0)) {
    i = 0;
    do {
      if ((*(uint *)&this->field_0x20 & 0x7fffffff) <= i) {
        return (ES5HeapArgumentsObject *)this;
      }
      this_00 = (this->deletedArgs).ptr;
      if ((this_00 == (BVSparse<Memory::Recycler> *)0x0) ||
         (BVar4 = BVSparse<Memory::Recycler>::Test(this_00,i), BVar4 == '\0')) {
        value = DynamicObject::GetSlot(&((this->frameObject).ptr)->super_DynamicObject,i);
        DynamicObject::SetObjectArrayItem((DynamicObject *)this,i,value,PropertyOperation_None);
      }
      i = i + 1;
    } while (i < this->formalCount);
  }
  return (ES5HeapArgumentsObject *)this;
}

Assistant:

ES5HeapArgumentsObject* HeapArgumentsObject::ConvertToES5HeapArgumentsObject(bool overwriteArgsUsingFrameObject)
    {
        if (!CrossSite::IsCrossSiteObjectTyped(this))
        {
            Assert(VirtualTableInfo<HeapArgumentsObject>::HasVirtualTable(this));
            VirtualTableInfo<ES5HeapArgumentsObject>::SetVirtualTable(this);
        }
        else
        {
            Assert(VirtualTableInfo<CrossSiteObject<HeapArgumentsObject>>::HasVirtualTable(this));
            VirtualTableInfo<CrossSiteObject<ES5HeapArgumentsObject>>::SetVirtualTable(this);
        }

        ES5HeapArgumentsObject* es5This = static_cast<ES5HeapArgumentsObject*>(this);

        if (overwriteArgsUsingFrameObject)
        {
            // Copy existing items to the array so that they are there before the user can call Object.preventExtensions,
            // after which we can no longer add new items to the objectArray.
            for (uint32 i = 0; i < this->formalCount && i < this->numOfArguments; ++i)
            {
                AssertMsg(this->IsFormalArgument(i), "this->IsFormalArgument(i)");
                if (!this->IsArgumentDeleted(i))
                {
                    // At this time the value doesn't matter, use one from slots.
                    this->SetObjectArrayItem(i, this->frameObject->GetSlot(i), PropertyOperation_None);
                }
            }
        }
        return es5This;

    }